

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.h
# Opt level: O1

void __thiscall bandit::reporter::info::test_run_error(info *this,string *desc,test_run_error *err)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ostream *poVar3;
  char *__s;
  size_t sVar4;
  _List_node_base *p_Var5;
  stringstream ss;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Failed to run \"",0xf);
  progress_base::current_context_name_abi_cxx11_(&local_1c0,(progress_base *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\": error \"",10);
  __s = (char *)(**(code **)(*(long *)err + 0x10))(err);
  if (__s == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar4 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  paVar2 = &local_1c0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c0._M_dataplus._M_p,
                    CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                             local_1c0.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringbuf::str();
  p_Var5 = (_List_node_base *)operator_new(0x30);
  p_Var5[1]._M_next = p_Var5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p == paVar2) {
    p_Var5[2]._M_next =
         (_List_node_base *)
         CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,local_1c0.field_2._M_local_buf[0]);
    p_Var5[2]._M_prev = (_List_node_base *)local_1c0.field_2._8_8_;
  }
  else {
    p_Var5[1]._M_next = (_List_node_base *)local_1c0._M_dataplus._M_p;
    p_Var5[2]._M_next =
         (_List_node_base *)
         CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,local_1c0.field_2._M_local_buf[0]);
  }
  p_Var5[1]._M_prev = (_List_node_base *)local_1c0._M_string_length;
  local_1c0._M_string_length = 0;
  local_1c0.field_2._M_local_buf[0] = '\0';
  local_1c0._M_dataplus._M_p = (pointer)paVar2;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  psVar1 = &(this->super_colored_base).super_progress_base.test_run_errors_.
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1c0._M_dataplus._M_p,
                    CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                             local_1c0.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void test_run_error(const std::string& desc, const detail::test_run_error& err) override {
        progress_base::test_run_error(desc, err);

        std::stringstream ss;
        ss << "Failed to run \"" << current_context_name() << "\": error \"" << err.what() << "\"" << std::endl;
        test_run_errors_.push_back(ss.str());
      }